

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catalog.c
# Opt level: O2

xmlChar * xmlParseSGMLCatalogPubid(xmlChar *cur,xmlChar **id)

{
  byte bVar1;
  bool bVar2;
  uint uVar3;
  xmlChar *pxVar4;
  xmlChar *pxVar5;
  byte bVar6;
  byte bVar7;
  uint uVar8;
  uint uVar9;
  ulong uVar10;
  xmlChar *local_48;
  
  *id = (xmlChar *)0x0;
  if (*cur == '\'') {
    bVar7 = 0x27;
LAB_0015d9cd:
    local_48 = cur + 1;
    bVar1 = 1;
    bVar2 = false;
  }
  else {
    if (*cur == '\"') {
      bVar7 = 0x22;
      goto LAB_0015d9cd;
    }
    bVar1 = 0;
    bVar7 = 0x20;
    bVar2 = true;
    local_48 = cur;
  }
  pxVar4 = (xmlChar *)(*xmlMalloc)(0x32);
  if (pxVar4 == (xmlChar *)0x0) {
    xmlCatalogErrMemory();
  }
  else {
    uVar3 = 0x32;
    uVar10 = 0;
    while( true ) {
      bVar6 = local_48[uVar10];
      if (((ulong)bVar6 != 0x3f && ""[bVar6] == '\0') || ((bool)(bVar7 == bVar6 & bVar1))) break;
      if (((bVar2) && (bVar6 < 0x21)) && ((0x100002600U >> ((ulong)bVar6 & 0x3f) & 1) != 0)) {
        pxVar4[uVar10 & 0xffffffff] = '\0';
        goto LAB_0015daee;
      }
      pxVar5 = pxVar4;
      if ((int)uVar3 <= (int)uVar10 + 1) {
        uVar9 = 1;
        if ((int)uVar3 < 1) {
LAB_0015da97:
          pxVar5 = (xmlChar *)(*xmlRealloc)(pxVar4,(size_t)uVar9);
          if (pxVar5 != (xmlChar *)0x0) {
            bVar6 = local_48[uVar10];
            uVar3 = uVar9;
            goto LAB_0015dac6;
          }
        }
        else if (uVar3 < 1000000000) {
          uVar8 = uVar3 + 1 >> 1;
          uVar9 = uVar8 + uVar3;
          if (1000000000 - uVar8 < uVar3) {
            uVar9 = 1000000000;
          }
          goto LAB_0015da97;
        }
        xmlCatalogErrMemory();
        goto LAB_0015db42;
      }
LAB_0015dac6:
      pxVar5[uVar10] = bVar6;
      uVar10 = uVar10 + 1;
      pxVar4 = pxVar5;
    }
    pxVar4[uVar10 & 0xffffffff] = '\0';
    if (bVar2) {
LAB_0015daee:
      if (((ulong)local_48[uVar10] < 0x21) &&
         ((0x100002600U >> ((ulong)local_48[uVar10] & 0x3f) & 1) != 0)) {
LAB_0015db0c:
        *id = pxVar4;
        return local_48 + uVar10;
      }
    }
    else if (bVar7 == local_48[uVar10]) {
      uVar10 = uVar10 + 1;
      goto LAB_0015db0c;
    }
LAB_0015db42:
    (*xmlFree)(pxVar4);
  }
  return (xmlChar *)0x0;
}

Assistant:

static const xmlChar *
xmlParseSGMLCatalogPubid(const xmlChar *cur, xmlChar **id) {
    xmlChar *buf = NULL;
    int len = 0;
    int size = 50;
    xmlChar stop;

    *id = NULL;

    if (RAW == '"') {
        NEXT;
	stop = '"';
    } else if (RAW == '\'') {
        NEXT;
	stop = '\'';
    } else {
	stop = ' ';
    }
    buf = xmlMalloc(size);
    if (buf == NULL) {
        xmlCatalogErrMemory();
	return(NULL);
    }
    while (IS_PUBIDCHAR_CH(*cur) || (*cur == '?')) {
	if ((*cur == stop) && (stop != ' '))
	    break;
	if ((stop == ' ') && (IS_BLANK_CH(*cur)))
	    break;
	if (len + 1 >= size) {
            xmlChar *tmp;
            int newSize;

            newSize = xmlGrowCapacity(size, 1, 1, XML_MAX_ITEMS);
            if (newSize < 0) {
		xmlCatalogErrMemory();
		xmlFree(buf);
		return(NULL);
            }
	    tmp = xmlRealloc(buf, newSize);
	    if (tmp == NULL) {
		xmlCatalogErrMemory();
		xmlFree(buf);
		return(NULL);
	    }
	    buf = tmp;
            size = newSize;
	}
	buf[len++] = *cur;
	NEXT;
    }
    buf[len] = 0;
    if (stop == ' ') {
	if (!IS_BLANK_CH(*cur)) {
	    xmlFree(buf);
	    return(NULL);
	}
    } else {
	if (*cur != stop) {
	    xmlFree(buf);
	    return(NULL);
	}
	NEXT;
    }
    *id = buf;
    return(cur);
}